

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::LE_Fire_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,LE_Fire_PDU *this)

{
  byte bVar1;
  ostream *poVar2;
  KStringStream ss;
  KString KStack_228;
  KString local_208;
  KString local_1e8;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  LE_Header::GetAsString_abi_cxx11_(&KStack_228,&this->super_LE_Header);
  poVar2 = std::operator<<(local_198,(string *)&KStack_228);
  poVar2 = std::operator<<(poVar2,"-LE Fire PDU-\n");
  poVar2 = std::operator<<(poVar2,"Optional Field Flags:\n");
  poVar2 = std::operator<<(poVar2,"\tTarget ID:                            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tMunition ID:                          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag >> 2 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tMunition Site & Application Included: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tEvent Site & Application Included:    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag >> 3 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tWarhead & Fuse Included:              ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag >> 4 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tQuantity & Rate Included:             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag >> 5 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tLocation:                             ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_FireFlagUnion).m_ui8Flag >> 6 & 1);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&KStack_228);
  bVar1 = (this->m_FireFlagUnion).m_ui8Flag;
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<(local_198,"Target ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&KStack_228,&this->m_TargetID);
    std::operator<<(poVar2,(string *)&KStack_228);
    std::__cxx11::string::~string((string *)&KStack_228);
    bVar1 = (this->m_FireFlagUnion).m_ui8Flag;
  }
  if ((bVar1 & 4) != 0) {
    poVar2 = std::operator<<(local_198,"Munition ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&KStack_228,&this->m_MunitionID);
    std::operator<<(poVar2,(string *)&KStack_228);
    std::__cxx11::string::~string((string *)&KStack_228);
  }
  poVar2 = std::operator<<(local_198,"Event ID: ");
  DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&KStack_228,&this->m_EventID);
  poVar2 = std::operator<<(poVar2,(string *)&KStack_228);
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_(&local_1c8,&this->m_MunitionDesc);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_1e8,&this->m_Loc);
  poVar2 = std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2,"Velocity: ");
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_208,&this->m_Vel);
  poVar2 = std::operator<<(poVar2,(string *)&local_208);
  poVar2 = std::operator<<(poVar2,"Range: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16Range);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&KStack_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-LE Fire PDU-\n"
       << "Optional Field Flags:\n"
       << "\tTarget ID:                            " << ( KUINT16 )m_FireFlagUnion.m_ui8TargetId         << "\n"
       << "\tMunition ID:                          " << ( KUINT16 )m_FireFlagUnion.m_ui8MunitionId       << "\n"
       << "\tMunition Site & Application Included: " << ( KUINT16 )m_FireFlagUnion.m_ui8MunitionSiteApp  << "\n"
       << "\tEvent Site & Application Included:    " << ( KUINT16 )m_FireFlagUnion.m_ui8EventSiteAppId   << "\n"
       << "\tWarhead & Fuse Included:              " << ( KUINT16 )m_FireFlagUnion.m_ui8WarheadFuse      << "\n"
       << "\tQuantity & Rate Included:             " << ( KUINT16 )m_FireFlagUnion.m_ui8QuantRate        << "\n"
       << "\tLocation:                             " << ( KUINT16 )m_FireFlagUnion.m_ui8Location         << "\n";

    if( m_FireFlagUnion.m_ui8TargetId )
    {
        ss << "Target ID: " << m_TargetID.GetAsString();
    }

    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        ss << "Munition ID: " << m_MunitionID.GetAsString();
    }

    ss << "Event ID: " << m_EventID.GetAsString()
       << m_MunitionDesc.GetAsString()
       << m_Loc.GetAsString()
       << "Velocity: " << m_Vel.GetAsString()
       << "Range: " << m_ui16Range
       << "\n";

    return ss.str();
}